

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.hpp
# Opt level: O0

void __thiscall rr::VertexAttrib::VertexAttrib(VertexAttrib *this)

{
  VertexAttrib *this_local;
  
  this->type = VERTEXATTRIBTYPE_FLOAT;
  this->size = 0;
  this->stride = 0;
  this->instanceDivisor = 0;
  this->pointer = (void *)0x0;
  GenericVec4::GenericVec4(&this->generic);
  return;
}

Assistant:

VertexAttrib (void)
		: type				(VERTEXATTRIBTYPE_FLOAT)
		, size				(0)
		, stride			(0)
		, instanceDivisor	(0)
		, pointer			(DE_NULL)
	{
	}